

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void TPZFrontNonSym<double>::main(void)

{
  long col;
  double dVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  TPZVec<long> DestIndex;
  string OutFile;
  TPZFMatrix<double> Load_2;
  TPZFMatrix<double> Load;
  TPZFMatrix<double> Prova;
  TPZFMatrix<double> TestMatrix;
  TPZFrontNonSym<double> TestFront;
  ofstream outeqn;
  ofstream output;
  TPZEqnArray<double> Result;
  
  TPZFMatrix<double>::TPZFMatrix(&TestMatrix,6,6);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    for (lVar4 = 0; col = lVar5 + lVar4, col != 6; lVar4 = lVar4 + 1) {
      iVar2 = rand();
      pdVar3 = TPZFMatrix<double>::operator()(&TestMatrix,lVar5,col);
      *pdVar3 = (double)((iVar2 * 6) / 0x7fff);
      pdVar3 = TPZFMatrix<double>::operator()(&TestMatrix,lVar5,col);
      dVar1 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()(&TestMatrix,col,lVar5);
      *pdVar3 = dVar1;
      if (lVar4 == 0) {
        pdVar3 = TPZFMatrix<double>::operator()(&TestMatrix,lVar5,lVar5);
        *pdVar3 = 6000.0;
      }
    }
  }
  TPZFMatrix<double>::TPZFMatrix(&Prova);
  TPZFMatrix<double>::operator=(&Prova,&TestMatrix);
  TPZMatrix<double>::Print
            (&Prova.super_TPZMatrix<double>,"TPZFMatrix<TVar> Cholesky",(ostream *)&std::cout,
             EFormatted);
  TPZFrontNonSym(&TestFront,6);
  TPZVec<long>::TPZVec(&DestIndex,6);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    DestIndex.fStore[lVar5] = lVar5;
  }
  SymbolicAddKel(&TestFront,&DestIndex);
  SymbolicDecomposeEquations(&TestFront,0,5);
  OutFile._M_dataplus._M_p = (pointer)&OutFile.field_2;
  OutFile._M_string_length = 0;
  OutFile.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&OutFile);
  std::ofstream::ofstream(&output,OutFile._M_dataplus._M_p,_S_app);
  Compress(&TestFront);
  AllocData(&TestFront);
  AddKel(&TestFront,&TestMatrix,&DestIndex);
  TPZEqnArray<double>::TPZEqnArray(&Result);
  DecomposeEquations(&TestFront,0,5,&Result);
  std::ofstream::ofstream(&outeqn,"TestEQNArray.txt",_S_app);
  TPZEqnArray<double>::Print(&Result,"TestEQNArray.txt",(ostream *)&outeqn);
  TPZFMatrix<double>::TPZFMatrix(&Load,6,1);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    iVar2 = rand();
    pdVar3 = TPZFMatrix<double>::operator()(&Load,lVar5,0);
    *pdVar3 = (double)((iVar2 * 6) / 0x7fff);
  }
  TPZFMatrix<double>::TPZFMatrix(&Load_2,6,1);
  TPZFMatrix<double>::operator=(&Load_2,&Load);
  TPZMatrix<double>::SolveDirect(&Prova.super_TPZMatrix<double>,&Load,ECholesky);
  TPZMatrix<double>::Print(&Load.super_TPZMatrix<double>,"Load",(ostream *)&std::cout,EFormatted);
  TPZEqnArray<double>::EqnForward(&Result,&Load_2,ECholesky);
  TPZEqnArray<double>::EqnBackward(&Result,&Load_2,ECholesky);
  TPZMatrix<double>::Print(&Load_2.super_TPZMatrix<double>,"Eqn",(ostream *)&std::cout,EFormatted);
  TPZFMatrix<double>::~TPZFMatrix(&Load_2);
  TPZFMatrix<double>::~TPZFMatrix(&Load);
  std::ofstream::~ofstream(&outeqn);
  TPZEqnArray<double>::~TPZEqnArray(&Result);
  std::ofstream::~ofstream(&output);
  std::__cxx11::string::~string((string *)&OutFile);
  TPZVec<long>::~TPZVec(&DestIndex);
  ~TPZFrontNonSym(&TestFront);
  TPZFMatrix<double>::~TPZFMatrix(&Prova);
  TPZFMatrix<double>::~TPZFMatrix(&TestMatrix);
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::main()
{
	int i, j;
	/**
	 * 	Populates data structure
	 */
	int matsize=6;
	TPZFMatrix<TVar> TestMatrix(matsize,matsize);
	for(i=0;i<matsize;i++) {
		for(j=i;j<matsize;j++) {
			int random = rand();
			double rnd = (random*matsize)/0x7fff;
			TestMatrix(i,j)=rnd;
			TestMatrix(j,i)=TestMatrix(i,j);
			if(i==j) TestMatrix(i,j)=6000.;
		}
	}
	
	TPZFMatrix<TVar> Prova;
	Prova=TestMatrix;
	
	//	Prova.Decompose_Cholesky();
	Prova.Print("TPZFMatrix<TVar> Cholesky");
	
	TPZFrontNonSym TestFront(matsize);
	
	
	TPZVec<int64_t> DestIndex(matsize);
	for(i=0;i<matsize;i++) DestIndex[i]=i;
	
	TestFront.SymbolicAddKel(DestIndex);
	TestFront.SymbolicDecomposeEquations(0,matsize-1); 
	
	std::string OutFile;
	OutFile = "TPZFrontNonSymTest.txt";
	
	ofstream output(OutFile.c_str(),ios::app);
	
	TestFront.Compress();
	
	TestFront.AllocData();
	
	TestFront.AddKel(TestMatrix, DestIndex);
	TPZEqnArray<TVar> Result;

	TestFront.DecomposeEquations(0,matsize-1,Result);
	ofstream outeqn("TestEQNArray.txt",ios::app);
	
	Result.Print("TestEQNArray.txt",outeqn);
	
	
	TPZFMatrix<TVar> Load(matsize);
	
	for(i=0;i<matsize;i++) {
		int random = rand();
		double rnd = (random*matsize)/0x7fff;
		Load(i,0)=rnd;
	}
	
	TPZFMatrix<TVar> Load_2(matsize);
	Load_2=Load;
	
	DecomposeType decType = ECholesky;
	Prova.SolveDirect(Load, decType);
	
	Load.Print("Load");
	//TestFront.Print(OutFile, output);
	
	Result.EqnForward(Load_2, decType);
	Result.EqnBackward(Load_2, decType);
	
	Load_2.Print("Eqn");
}